

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  void **in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  int ret;
  ssize_t bytes;
  _7zip_conflict *zip;
  uint in_stack_ffffffffffffffc0;
  size_t minimum;
  int local_4;
  
  local_4 = 0;
  minimum = *(size_t *)in_RDI[0x15].archive_format_name;
  if (*(int *)(minimum + 0x50a0) == -1) {
    *(undefined4 *)(minimum + 0x50a0) = 0;
  }
  if (*(long *)(minimum + 0x120) != 0) {
    read_consume((archive_read *)(ulong)in_stack_ffffffffffffffc0);
  }
  *in_RCX = *(undefined8 *)(minimum + 0xb8);
  *in_RDX = (void *)0x0;
  (in_RSI->archive).magic = 0;
  (in_RSI->archive).state = 0;
  if (*(char *)(minimum + 0xd0) == '\0') {
    pvVar1 = (void *)read_stream(in_RSI,in_RDX,(size_t)in_RCX,minimum);
    if ((long)pvVar1 < 0) {
      local_4 = (int)pvVar1;
    }
    else if (pvVar1 == (void *)0x0) {
      archive_set_error(in_RDI,0x54,"Truncated 7-Zip file body");
      local_4 = -0x1e;
    }
    else {
      *(long *)(minimum + 0xc0) = *(long *)(minimum + 0xc0) - (long)pvVar1;
      if (*(long *)(minimum + 0xc0) == 0) {
        *(undefined1 *)(minimum + 0xd0) = 1;
      }
      if (((*(uint *)(*(long *)(minimum + 0xa8) + 0x18) & 8) != 0) && (pvVar1 != (void *)0x0)) {
        uVar2._0_4_ = (in_RSI->archive).magic;
        uVar2._4_4_ = (in_RSI->archive).state;
        uVar2 = crc32(*(undefined8 *)(minimum + 200),uVar2,(ulong)pvVar1 & 0xffffffff);
        *(undefined8 *)(minimum + 200) = uVar2;
      }
      if (((*(char *)(minimum + 0xd0) != '\0') &&
          ((*(uint *)(*(long *)(minimum + 0xa8) + 0x18) & 8) != 0)) &&
         ((ulong)*(uint *)(*(long *)(minimum + 0x60) +
                          (ulong)*(uint *)(*(long *)(minimum + 0xa8) + 0x14) * 4) !=
          *(ulong *)(minimum + 200))) {
        archive_set_error(in_RDI,-1,"7-Zip bad CRC: 0x%lx should be 0x%lx",
                          *(undefined8 *)(minimum + 200),
                          (ulong)*(uint *)(*(long *)(minimum + 0x60) +
                                          (ulong)*(uint *)(*(long *)(minimum + 0xa8) + 0x14) * 4));
        local_4 = -0x14;
      }
      *in_RDX = pvVar1;
      *in_RCX = *(undefined8 *)(minimum + 0xb8);
      *(long *)(minimum + 0xb8) = (long)pvVar1 + *(long *)(minimum + 0xb8);
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_7zip_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct _7zip *zip;
	ssize_t bytes;
	int ret = ARCHIVE_OK;

	zip = (struct _7zip *)(a->format->data);

	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	*offset = zip->entry_offset;
	*size = 0;
	*buff = NULL;
	/*
	 * If we hit end-of-entry last time, clean up and return
	 * ARCHIVE_EOF this time.
	 */
	if (zip->end_of_entry)
		return (ARCHIVE_EOF);

	bytes = read_stream(a, buff,
		(size_t)zip->entry_bytes_remaining, 0);
	if (bytes < 0)
		return ((int)bytes);
	if (bytes == 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated 7-Zip file body");
		return (ARCHIVE_FATAL);
	}
	zip->entry_bytes_remaining -= bytes;
	if (zip->entry_bytes_remaining == 0)
		zip->end_of_entry = 1;

	/* Update checksum */
	if ((zip->entry->flg & CRC32_IS_SET) && bytes)
		zip->entry_crc32 = crc32(zip->entry_crc32, *buff,
		    (unsigned)bytes);

	/* If we hit the end, swallow any end-of-data marker. */
	if (zip->end_of_entry) {
		/* Check computed CRC against file contents. */
		if ((zip->entry->flg & CRC32_IS_SET) &&
			zip->si.ss.digests[zip->entry->ssIndex] !=
		    zip->entry_crc32) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "7-Zip bad CRC: 0x%lx should be 0x%lx",
			    (unsigned long)zip->entry_crc32,
			    (unsigned long)zip->si.ss.digests[
			    		zip->entry->ssIndex]);
			ret = ARCHIVE_WARN;
		}
	}

	*size = bytes;
	*offset = zip->entry_offset;
	zip->entry_offset += bytes;

	return (ret);
}